

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

decimal_fp<double> fmt::v11::detail::dragonbox::to_decimal<double>(double x)

{
  bool bVar1;
  compute_mul_parity_result cVar2;
  int iVar3;
  int iVar4;
  uint32_t uVar5;
  uint uVar6;
  unsigned_long uVar7;
  carrier_uint cVar8;
  ulong uVar9;
  uint64_t uVar10;
  compute_mul_result cVar11;
  decimal_fp<double> dVar12;
  compute_mul_parity_result y_mul;
  bool divisible_by_small_divisor;
  bool approx_y_parity;
  uint32_t dist;
  compute_mul_parity_result x_mul;
  uint32_t r;
  compute_mul_result z_mul;
  carrier_uint two_fc;
  uint32_t deltai;
  int beta;
  cache_entry_type cache;
  int minus_k;
  bool include_right_endpoint;
  bool include_left_endpoint;
  int exponent;
  carrier_uint significand;
  carrier_uint significand_mask;
  unsigned_long br;
  decimal_fp<double> ret_value;
  carrier_uint zi;
  carrier_uint xi;
  cache_entry_type cache_1;
  int beta_1;
  int minus_k_1;
  decimal_fp<double> ret_value_1;
  uint64_t q;
  uint64_t q_3;
  int s;
  uint64_t mod_inv_25;
  uint64_t mod_inv_5;
  int s_1;
  uint32_t n32;
  uint128_fallback nm;
  uint64_t magic_number;
  uint32_t q_1;
  uint32_t q_2;
  uint32_t mod_inv_25_1;
  uint32_t mod_inv_5_1;
  uint64_t q_4;
  uint64_t q_7;
  int s_2;
  uint64_t mod_inv_25_2;
  uint64_t mod_inv_5_2;
  int s_3;
  uint32_t n32_1;
  uint128_fallback nm_1;
  uint64_t magic_number_1;
  uint32_t q_5;
  uint32_t q_6;
  uint32_t mod_inv_25_3;
  uint32_t mod_inv_5_3;
  int in_stack_fffffffffffffd8c;
  cache_entry_type *in_stack_fffffffffffffd90;
  uint64_t in_stack_fffffffffffffd98;
  cache_entry_type *in_stack_fffffffffffffda0;
  undefined8 in_stack_fffffffffffffda8;
  int beta_00;
  undefined4 in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdb4;
  undefined4 in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdbc;
  undefined4 in_stack_fffffffffffffdc0;
  ulong local_230;
  int k;
  bool local_1c0;
  bool bStack_1bf;
  bool bStack_1b5;
  uint local_1b4;
  int local_174;
  ulong local_170;
  double local_158;
  uint64_t local_150;
  int local_148;
  ulong local_140;
  carrier_uint local_138;
  uint128_fallback local_130;
  int local_11c;
  int local_118;
  int local_114;
  ulong local_110;
  int local_108;
  uint64_t local_100;
  uint64_t local_f8;
  uint local_ec;
  undefined8 local_e8;
  undefined8 local_e0;
  uint local_d8;
  uint local_d4;
  uint128_fallback local_d0;
  undefined8 local_c0;
  bool local_b1;
  uint64_t *local_b0;
  uint local_a4;
  uint32_t local_a0;
  uint32_t local_9c;
  undefined4 local_98;
  undefined4 local_94;
  bool local_8d;
  uint local_8c;
  uint32_t *local_88;
  uint64_t local_80;
  uint64_t local_78;
  uint local_6c;
  undefined8 local_68;
  undefined8 local_60;
  uint local_58;
  uint local_54;
  uint128_fallback local_50;
  undefined8 local_40;
  bool local_31;
  uint64_t *local_30;
  uint local_24;
  uint32_t local_20;
  uint32_t local_1c;
  undefined4 local_18;
  undefined4 local_14;
  bool local_d;
  uint local_c;
  uint32_t *local_8;
  
  beta_00 = (int)((ulong)in_stack_fffffffffffffda8 >> 0x20);
  uVar7 = bit_cast<unsigned_long,_double,_0>(&local_158);
  local_170 = uVar7 & 0xfffffffffffff;
  cVar8 = exponent_mask<double>();
  uVar9 = uVar7 & cVar8;
  iVar3 = num_significand_bits<double>();
  k = (int)(cVar8 >> 0x20);
  local_174 = (int)(uVar9 >> ((byte)iVar3 & 0x3f));
  if (local_174 == 0) {
    if (local_170 == 0) {
      local_150 = 0;
      local_148 = 0;
      goto LAB_002a6033;
    }
    local_174 = num_significand_bits<double>();
    local_174 = -0x3fe - local_174;
  }
  else {
    iVar3 = exponent_bias<double>();
    iVar4 = num_significand_bits<double>();
    local_174 = local_174 - (iVar3 + iVar4);
    if (local_170 == 0) {
      local_114 = local_174;
      local_118 = floor_log10_pow2_minus_log10_4_over_3(0);
      iVar3 = local_114;
      local_11c = floor_log2_pow10(0);
      local_11c = iVar3 + local_11c;
      local_130 = cache_accessor<double>::get_cached_power(k);
      local_138 = cache_accessor<double>::compute_left_endpoint_for_shorter_interval_case
                            (in_stack_fffffffffffffda0,(int)(in_stack_fffffffffffffd98 >> 0x20));
      local_140 = cache_accessor<double>::compute_right_endpoint_for_shorter_interval_case
                            (in_stack_fffffffffffffda0,(int)(in_stack_fffffffffffffd98 >> 0x20));
      bVar1 = is_left_endpoint_integer_shorter_interval<double>(local_114);
      if (!bVar1) {
        local_138 = local_138 + 1;
      }
      local_110 = local_140 / 10;
      if (local_110 * 10 < local_138) {
        local_230 = cache_accessor<double>::compute_round_up_for_shorter_interval_case
                              (in_stack_fffffffffffffd90,in_stack_fffffffffffffd8c);
        local_108 = local_118;
        if ((local_114 < -0x4d) || (-0x4d < local_114)) {
          local_110 = local_230;
          if (local_230 < local_138) {
            local_110 = local_230 + 1;
          }
        }
        else {
          if ((local_230 & 1) != 0) {
            local_230 = local_230 - 1;
          }
          local_110 = local_230;
        }
      }
      else {
        local_108 = local_118 + 1;
        local_b0 = &local_110;
        local_b1 = local_110 != 0;
        ignore_unused<bool,char[1]>(&local_b1,(char (*) [1])0x2c5fea);
        local_c0 = 0xabcc77118461cefd;
        local_d0 = umul128((uint64_t)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
        uVar10 = uint128_fallback::high(&local_d0);
        if (((uVar10 & 0x3ffffff) == 0) &&
           (uVar10 = uint128_fallback::low(&local_d0), uVar10 < 0xabcc77118461cefd)) {
          uVar10 = uint128_fallback::high(&local_d0);
          local_d4 = (uint)(uVar10 >> 0x1a);
          local_88 = &local_d4;
          local_8c = 8;
          local_8d = local_d4 != 0;
          ignore_unused<bool,char[1]>(&local_8d,(char (*) [1])0x2c5fea);
          local_94 = 0xcccccccd;
          local_98 = 0xc28f5c29;
          while( true ) {
            uVar5 = rotr(*local_88 * -0x3d70a3d7,2);
            local_9c = uVar5;
            uVar6 = max_value<unsigned_int>();
            if (uVar6 / 100 < uVar5) break;
            *local_88 = local_9c;
            local_8c = local_8c + 2;
          }
          uVar5 = rotr(*local_88 * -0x33333333,1);
          local_a0 = uVar5;
          uVar6 = max_value<unsigned_int>();
          if (uVar5 <= uVar6 / 10) {
            *local_88 = local_a0;
            local_8c = local_8c | 1;
          }
          local_d8 = local_8c;
          *local_b0 = (ulong)local_d4;
          local_a4 = local_d8;
        }
        else {
          local_e0 = 0xcccccccccccccccd;
          local_e8 = 0x8f5c28f5c28f5c29;
          local_ec = 0;
          while( true ) {
            uVar10 = rotr(*local_b0 * -0x70a3d70a3d70a3d7,2);
            local_f8 = uVar10;
            uVar7 = max_value<unsigned_long>();
            if (uVar7 / 100 < uVar10) break;
            *local_b0 = local_f8;
            local_ec = local_ec + 2;
          }
          uVar10 = rotr(*local_b0 * -0x3333333333333333,1);
          local_100 = uVar10;
          uVar7 = max_value<unsigned_long>();
          if (uVar10 <= uVar7 / 10) {
            *local_b0 = local_100;
            local_ec = local_ec | 1;
          }
          local_a4 = local_ec;
        }
        local_108 = local_a4 + local_108;
      }
      local_150 = local_110;
      local_148 = local_108;
      goto LAB_002a6033;
    }
    iVar3 = num_significand_bits<double>();
    local_170 = 1L << ((byte)iVar3 & 0x3f) | local_170;
  }
  bVar1 = (local_170 & 1) == 0;
  iVar3 = floor_log10_pow2(0);
  cache_accessor<double>::get_cached_power(k);
  floor_log2_pow10(0);
  uVar5 = cache_accessor<double>::compute_delta(in_stack_fffffffffffffd90,in_stack_fffffffffffffd8c)
  ;
  cVar11 = cache_accessor<double>::compute_mul
                     (CONCAT44(local_174,in_stack_fffffffffffffdc0),
                      (cache_entry_type *)
                      CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
  local_150 = divide_by_10_to_kappa_plus_1(0x2a5a39);
  local_1b4 = (int)cVar11.result + (int)local_150 * -1000;
  if (local_1b4 < uVar5) {
    if ((local_1b4 != 0) || ((cVar11.is_integer & 1U & !bVar1) == 0)) {
LAB_002a5b37:
      local_148 = iVar3 + 1;
      local_30 = &local_150;
      local_31 = local_150 != 0;
      ignore_unused<bool,char[1]>(&local_31,(char (*) [1])0x2c5fea);
      local_40 = 0xabcc77118461cefd;
      local_50 = umul128((uint64_t)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
      uVar10 = uint128_fallback::high(&local_50);
      if (((uVar10 & 0x3ffffff) == 0) &&
         (uVar10 = uint128_fallback::low(&local_50), uVar10 < 0xabcc77118461cefd)) {
        uVar10 = uint128_fallback::high(&local_50);
        local_54 = (uint)(uVar10 >> 0x1a);
        local_8 = &local_54;
        local_c = 8;
        local_d = local_54 != 0;
        ignore_unused<bool,char[1]>(&local_d,(char (*) [1])0x2c5fea);
        local_14 = 0xcccccccd;
        local_18 = 0xc28f5c29;
        while( true ) {
          uVar5 = rotr(*local_8 * -0x3d70a3d7,2);
          local_1c = uVar5;
          uVar6 = max_value<unsigned_int>();
          if (uVar6 / 100 < uVar5) break;
          *local_8 = local_1c;
          local_c = local_c + 2;
        }
        uVar5 = rotr(*local_8 * -0x33333333,1);
        local_20 = uVar5;
        uVar6 = max_value<unsigned_int>();
        if (uVar5 <= uVar6 / 10) {
          *local_8 = local_20;
          local_c = local_c | 1;
        }
        local_58 = local_c;
        *local_30 = (ulong)local_54;
        local_24 = local_58;
      }
      else {
        local_60 = 0xcccccccccccccccd;
        local_68 = 0x8f5c28f5c28f5c29;
        local_6c = 0;
        while( true ) {
          uVar10 = rotr(*local_30 * -0x70a3d70a3d70a3d7,2);
          local_78 = uVar10;
          uVar7 = max_value<unsigned_long>();
          if (uVar7 / 100 < uVar10) break;
          *local_30 = local_78;
          local_6c = local_6c + 2;
        }
        uVar10 = rotr(*local_30 * -0x3333333333333333,1);
        local_80 = uVar10;
        uVar7 = max_value<unsigned_long>();
        if (uVar10 <= uVar7 / 10) {
          *local_30 = local_80;
          local_6c = local_6c | 1;
        }
        local_24 = local_6c;
      }
      local_148 = local_24 + local_148;
      goto LAB_002a6033;
    }
    local_150 = local_150 - 1;
    local_1b4 = 1000;
  }
  else if (local_1b4 <= uVar5) {
    cVar2 = cache_accessor<double>::compute_mul_parity
                      (CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
                       (cache_entry_type *)
                       CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),beta_00);
    bStack_1b5 = cVar2.is_integer;
    if (((ushort)cVar2 & 1) != 0 || (bStack_1b5 & 1U & bVar1) != 0) goto LAB_002a5b37;
  }
  local_150 = local_150 * 10;
  uVar6 = (local_1b4 - (uVar5 >> 1)) + 0x32;
  local_148 = iVar3;
  bVar1 = check_divisibility_and_divide_by_pow10<2>((uint32_t *)in_stack_fffffffffffffda0);
  local_150 = uVar6 + local_150;
  if (bVar1) {
    cVar2 = cache_accessor<double>::compute_mul_parity
                      (CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
                       (cache_entry_type *)
                       CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),beta_00);
    local_1c0 = cVar2.parity;
    if ((bool)(local_1c0 & 1U) == ((uVar6 & 1) != 0)) {
      bStack_1bf = cVar2.is_integer;
      if ((bStack_1bf & 1U & (local_150 & 1) != 0) != 0) {
        local_150 = local_150 - 1;
      }
    }
    else {
      local_150 = local_150 - 1;
    }
  }
LAB_002a6033:
  dVar12.exponent = local_148;
  dVar12.significand = local_150;
  dVar12._12_4_ = 0;
  return dVar12;
}

Assistant:

auto to_decimal(T x) noexcept -> decimal_fp<T> {
  // Step 1: integer promotion & Schubfach multiplier calculation.

  using carrier_uint = typename float_info<T>::carrier_uint;
  using cache_entry_type = typename cache_accessor<T>::cache_entry_type;
  auto br = bit_cast<carrier_uint>(x);

  // Extract significand bits and exponent bits.
  const carrier_uint significand_mask =
      (static_cast<carrier_uint>(1) << num_significand_bits<T>()) - 1;
  carrier_uint significand = (br & significand_mask);
  int exponent =
      static_cast<int>((br & exponent_mask<T>()) >> num_significand_bits<T>());

  if (exponent != 0) {  // Check if normal.
    exponent -= exponent_bias<T>() + num_significand_bits<T>();

    // Shorter interval case; proceed like Schubfach.
    // In fact, when exponent == 1 and significand == 0, the interval is
    // regular. However, it can be shown that the end-results are anyway same.
    if (significand == 0) return shorter_interval_case<T>(exponent);

    significand |= (static_cast<carrier_uint>(1) << num_significand_bits<T>());
  } else {
    // Subnormal case; the interval is always regular.
    if (significand == 0) return {0, 0};
    exponent =
        std::numeric_limits<T>::min_exponent - num_significand_bits<T>() - 1;
  }

  const bool include_left_endpoint = (significand % 2 == 0);
  const bool include_right_endpoint = include_left_endpoint;

  // Compute k and beta.
  const int minus_k = floor_log10_pow2(exponent) - float_info<T>::kappa;
  const cache_entry_type cache = cache_accessor<T>::get_cached_power(-minus_k);
  const int beta = exponent + floor_log2_pow10(-minus_k);

  // Compute zi and deltai.
  // 10^kappa <= deltai < 10^(kappa + 1)
  const uint32_t deltai = cache_accessor<T>::compute_delta(cache, beta);
  const carrier_uint two_fc = significand << 1;

  // For the case of binary32, the result of integer check is not correct for
  // 29711844 * 2^-82
  // = 6.1442653300000000008655037797566933477355632930994033813476... * 10^-18
  // and 29711844 * 2^-81
  // = 1.2288530660000000001731007559513386695471126586198806762695... * 10^-17,
  // and they are the unique counterexamples. However, since 29711844 is even,
  // this does not cause any problem for the endpoints calculations; it can only
  // cause a problem when we need to perform integer check for the center.
  // Fortunately, with these inputs, that branch is never executed, so we are
  // fine.
  const typename cache_accessor<T>::compute_mul_result z_mul =
      cache_accessor<T>::compute_mul((two_fc | 1) << beta, cache);

  // Step 2: Try larger divisor; remove trailing zeros if necessary.

  // Using an upper bound on zi, we might be able to optimize the division
  // better than the compiler; we are computing zi / big_divisor here.
  decimal_fp<T> ret_value;
  ret_value.significand = divide_by_10_to_kappa_plus_1(z_mul.result);
  uint32_t r = static_cast<uint32_t>(z_mul.result - float_info<T>::big_divisor *
                                                        ret_value.significand);

  if (r < deltai) {
    // Exclude the right endpoint if necessary.
    if (r == 0 && (z_mul.is_integer & !include_right_endpoint)) {
      --ret_value.significand;
      r = float_info<T>::big_divisor;
      goto small_divisor_case_label;
    }
  } else if (r > deltai) {
    goto small_divisor_case_label;
  } else {
    // r == deltai; compare fractional parts.
    const typename cache_accessor<T>::compute_mul_parity_result x_mul =
        cache_accessor<T>::compute_mul_parity(two_fc - 1, cache, beta);

    if (!(x_mul.parity | (x_mul.is_integer & include_left_endpoint)))
      goto small_divisor_case_label;
  }
  ret_value.exponent = minus_k + float_info<T>::kappa + 1;

  // We may need to remove trailing zeros.
  ret_value.exponent += remove_trailing_zeros(ret_value.significand);
  return ret_value;

  // Step 3: Find the significand with the smaller divisor.

small_divisor_case_label:
  ret_value.significand *= 10;
  ret_value.exponent = minus_k + float_info<T>::kappa;

  uint32_t dist = r - (deltai / 2) + (float_info<T>::small_divisor / 2);
  const bool approx_y_parity =
      ((dist ^ (float_info<T>::small_divisor / 2)) & 1) != 0;

  // Is dist divisible by 10^kappa?
  const bool divisible_by_small_divisor =
      check_divisibility_and_divide_by_pow10<float_info<T>::kappa>(dist);

  // Add dist / 10^kappa to the significand.
  ret_value.significand += dist;

  if (!divisible_by_small_divisor) return ret_value;

  // Check z^(f) >= epsilon^(f).
  // We have either yi == zi - epsiloni or yi == (zi - epsiloni) - 1,
  // where yi == zi - epsiloni if and only if z^(f) >= epsilon^(f).
  // Since there are only 2 possibilities, we only need to care about the
  // parity. Also, zi and r should have the same parity since the divisor
  // is an even number.
  const auto y_mul = cache_accessor<T>::compute_mul_parity(two_fc, cache, beta);

  // If z^(f) >= epsilon^(f), we might have a tie when z^(f) == epsilon^(f),
  // or equivalently, when y is an integer.
  if (y_mul.parity != approx_y_parity)
    --ret_value.significand;
  else if (y_mul.is_integer & (ret_value.significand % 2 != 0))
    --ret_value.significand;
  return ret_value;
}